

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O3

vector<skiwi::token,_std::allocator<skiwi::token>_> *
skiwi::tokenize(vector<skiwi::token,_std::allocator<skiwi::token>_> *__return_storage_ptr__,
               string *str)

{
  byte *pbVar1;
  long lVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  char cVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  bool is_a_symbol;
  int line_nr;
  string buff;
  int temp_line_nr;
  int temp_column_nr;
  stringstream str_1;
  bool local_259;
  int local_258;
  int local_254;
  string local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int local_210;
  int local_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  long local_200;
  long local_1f8 [2];
  e_type local_1e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  byte *local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250._M_string_length = 0;
  local_250.field_2._M_local_buf[0] = '\0';
  pbVar7 = (byte *)(str->_M_dataplus)._M_p;
  local_259 = false;
  local_254 = 1;
  local_258 = 1;
  if (0 < (long)str->_M_string_length) {
    pbVar4 = pbVar7 + str->_M_string_length;
    bVar9 = false;
    local_1c0 = pbVar4;
    do {
      bVar5 = *pbVar7;
      if (((ulong)bVar5 < 0x21) && ((0x100002600U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) {
        anon_unknown_3::_treat_buffer
                  (&local_250,__return_storage_ptr__,local_254,local_258,&local_259);
        iVar3 = local_254;
        do {
          bVar5 = *pbVar7;
          if (bVar5 < 0xd) {
            if (bVar5 != 9) {
              if (bVar5 != 10) goto LAB_00253d3e;
              iVar3 = iVar3 + 1;
              local_258 = 0;
              local_254 = iVar3;
            }
          }
          else if ((bVar5 != 0xd) && (bVar5 != 0x20)) goto LAB_00253d3e;
          pbVar7 = pbVar7 + 1;
          local_258 = local_258 + 1;
        } while( true );
      }
      pbVar8 = pbVar7;
      if (bVar9) goto switchD_00253d64_caseD_24;
LAB_00253d3e:
      pbVar8 = pbVar7;
      if (0x3a < bVar5) {
        if (bVar5 < 0x5d) {
          if (bVar5 == 0x3b) {
            anon_unknown_3::_treat_buffer
                      (&local_250,__return_storage_ptr__,local_254,local_258,&local_259);
            pbVar4 = pbVar7;
            do {
              pbVar8 = pbVar4 + 1;
              bVar5 = *pbVar4;
              if (bVar5 == 0) break;
              pbVar4 = pbVar8;
            } while (bVar5 != 10);
LAB_002542fb:
            local_254 = local_254 + 1;
            local_258 = 1;
            goto LAB_00254500;
          }
          if (bVar5 != 0x5b) goto switchD_00253d64_caseD_24;
          anon_unknown_3::_treat_buffer
                    (&local_250,__return_storage_ptr__,local_254,local_258,&local_259);
          local_1b8._0_4_ = 7;
          std::vector<skiwi::token,std::allocator<skiwi::token>>::
          emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                    ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                     (e_type *)local_1b8,(char (*) [2])"[",&local_254,&local_258);
        }
        else if (bVar5 == 0x5d) {
          anon_unknown_3::_treat_buffer
                    (&local_250,__return_storage_ptr__,local_254,local_258,&local_259);
          local_1b8._0_4_ = 8;
          std::vector<skiwi::token,std::allocator<skiwi::token>>::
          emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                    ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                     (e_type *)local_1b8,(char (*) [2])0x259e25,&local_254,&local_258);
        }
        else {
          if (bVar5 != 0x60) goto switchD_00253d64_caseD_24;
          anon_unknown_3::_treat_buffer
                    (&local_250,__return_storage_ptr__,local_254,local_258,&local_259);
          local_1b8._0_4_ = 2;
          std::vector<skiwi::token,std::allocator<skiwi::token>>::
          emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                    ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                     (e_type *)local_1b8,(char (*) [2])"`",&local_254,&local_258);
        }
        goto LAB_00254530;
      }
      switch(bVar5) {
      case 0x22:
        anon_unknown_3::_treat_buffer
                  (&local_250,__return_storage_ptr__,local_254,local_258,&local_259);
        local_20c = local_258;
        local_210 = local_254;
        iVar3 = local_254;
        do {
          pbVar4 = pbVar8;
          pbVar8 = pbVar4 + 1;
          local_258 = local_258 + 1;
          bVar5 = pbVar4[1];
          if (bVar5 == 10) {
            iVar3 = iVar3 + 1;
            local_258 = 0;
            bVar5 = *pbVar8;
            local_254 = iVar3;
          }
          else if ((bVar5 == 0) || (bVar5 == 0x22)) goto LAB_00253e4d;
        } while ((bVar5 != 0x5c) || (pbVar8 = pbVar4 + 2, pbVar4[2] != 0));
        local_208 = 0;
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,pbVar7,pbVar8);
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,std::__cxx11::string,int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   (e_type *)&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   &local_210,&local_20c);
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
        }
        bVar5 = *pbVar8;
LAB_00253e4d:
        if (bVar5 != 0) {
          pbVar8 = pbVar8 + 1;
          local_258 = local_258 + 1;
        }
        local_1e4 = T_STRING;
        local_230 = &local_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,pbVar7,pbVar8);
        cVar6 = (char)(string *)&local_230;
        lVar2 = std::__cxx11::string::find(cVar6,0x5c);
        if (lVar2 == -1) {
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          if (local_230 == &local_220) {
            local_1e0.field_2._8_8_ = local_220._8_8_;
          }
          else {
            local_1e0._M_dataplus._M_p = (pointer)local_230;
          }
          local_1e0.field_2._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
          local_1e0.field_2._M_local_buf[0] = local_220._M_local_buf[0];
          local_1e0._M_string_length = local_228;
          local_228 = 0;
          local_220._M_local_buf[0] = '\0';
          local_230 = &local_220;
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          do {
            std::__cxx11::string::substr((ulong)&local_208,(ulong)&local_230);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),(char *)CONCAT44(uStack_204,local_208),
                       local_200);
            if ((long *)CONCAT44(uStack_204,local_208) != local_1f8) {
              operator_delete((long *)CONCAT44(uStack_204,local_208),local_1f8[0] + 1);
            }
            bVar5 = local_230->_M_local_buf[lVar2 + 1];
            if (bVar5 < 0x6e) {
              if (bVar5 == 0x61) {
                local_208 = CONCAT31(local_208._1_3_,7);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b8 + 0x10),(char *)&local_208,1);
              }
              else if (bVar5 == 0x62) {
                local_208 = CONCAT31(local_208._1_3_,8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b8 + 0x10),(char *)&local_208,1);
              }
              else {
LAB_00253fa6:
                local_208 = CONCAT31(local_208._1_3_,bVar5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b8 + 0x10),(char *)&local_208,1);
              }
            }
            else if (bVar5 == 0x6e) {
              local_208 = CONCAT31(local_208._1_3_,10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),(char *)&local_208,1);
            }
            else if (bVar5 == 0x72) {
              local_208 = CONCAT31(local_208._1_3_,0xd);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),(char *)&local_208,1);
            }
            else {
              if (bVar5 != 0x74) goto LAB_00253fa6;
              local_208 = CONCAT31(local_208._1_3_,9);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),(char *)&local_208,1);
            }
            std::__cxx11::string::substr((ulong)&local_208,(ulong)&local_230);
            std::__cxx11::string::operator=((string *)&local_230,(string *)&local_208);
            if ((long *)CONCAT44(uStack_204,local_208) != local_1f8) {
              operator_delete((long *)CONCAT44(uStack_204,local_208),local_1f8[0] + 1);
            }
            lVar2 = std::__cxx11::string::find(cVar6,0x5c);
          } while (lVar2 != -1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),local_230->_M_local_buf,local_228);
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,std::__cxx11::string,int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   &local_1e4,&local_1e0,&local_210,&local_20c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230,
                          CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0])
                          + 1);
        }
        goto LAB_00254500;
      case 0x23:
        if (local_259 != false) goto switchD_00253d64_caseD_24;
        anon_unknown_3::_treat_buffer
                  (&local_250,__return_storage_ptr__,local_254,local_258,&local_259);
        if (pbVar7[1] == 0x7c) {
          local_258 = local_258 + 1;
          pbVar8 = pbVar7 + 2;
          iVar3 = local_254;
          do {
            while( true ) {
              pbVar4 = pbVar8 + 1;
              bVar5 = *pbVar8;
              if (bVar5 == 0x7c) break;
              if (bVar5 == 0) goto LAB_002543d5;
              if (bVar5 == 10) {
                local_254 = iVar3 + 1;
                local_258 = 1;
                pbVar8 = pbVar4;
                iVar3 = local_254;
              }
              else {
                local_258 = local_258 + 1;
                pbVar8 = pbVar4;
              }
            }
            pbVar8 = pbVar4;
          } while (*pbVar4 != 0x23);
          goto LAB_002543d5;
        }
        pbVar1 = pbVar7;
        if (pbVar7[1] == 0x3b) {
          do {
            pbVar8 = pbVar1 + 1;
            bVar5 = *pbVar1;
            if (bVar5 == 0) break;
            pbVar1 = pbVar8;
          } while (bVar5 != 10);
          goto LAB_002542fb;
        }
        local_259 = true;
        break;
      default:
        goto switchD_00253d64_caseD_24;
      case 0x27:
        anon_unknown_3::_treat_buffer
                  (&local_250,__return_storage_ptr__,local_254,local_258,&local_259);
        local_1b8._0_4_ = 1;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   (e_type *)local_1b8,(char (*) [2])"\'",&local_254,&local_258);
        break;
      case 0x28:
        if ((local_259 == true) && (local_250._M_string_length == 0)) {
          local_259 = false;
          local_1b8._0_4_ = 5;
          std::vector<skiwi::token,std::allocator<skiwi::token>>::
          emplace_back<skiwi::token::e_type,char_const(&)[3],int&,int&>
                    ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                     (e_type *)local_1b8,(char (*) [3])"#(",&local_254,&local_258);
        }
        else {
          anon_unknown_3::_treat_buffer
                    (&local_250,__return_storage_ptr__,local_254,local_258,&local_259);
          local_1b8._0_4_ = 5;
          std::vector<skiwi::token,std::allocator<skiwi::token>>::
          emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                    ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                     (e_type *)local_1b8,(char (*) [2])0x25c465,&local_254,&local_258);
        }
        break;
      case 0x29:
        anon_unknown_3::_treat_buffer
                  (&local_250,__return_storage_ptr__,local_254,local_258,&local_259);
        local_1b8._0_4_ = 6;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   (e_type *)local_1b8,(char (*) [2])0x25a381,&local_254,&local_258);
        break;
      case 0x2c:
        anon_unknown_3::_treat_buffer
                  (&local_250,__return_storage_ptr__,local_254,local_258,&local_259);
        if (pbVar7[1] == 0x40) {
          local_1b8._0_4_ = 4;
          std::vector<skiwi::token,std::allocator<skiwi::token>>::
          emplace_back<skiwi::token::e_type,char_const(&)[3],int&,int&>
                    ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                     (e_type *)local_1b8,(char (*) [3])",@",&local_254,&local_258);
          local_258 = local_258 + 1;
          pbVar8 = pbVar7 + 1;
        }
        else {
          local_1b8._0_4_ = 3;
          std::vector<skiwi::token,std::allocator<skiwi::token>>::
          emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                    ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                     (e_type *)local_1b8,(char (*) [2])",",&local_254,&local_258);
        }
LAB_002543d5:
        pbVar8 = pbVar8 + 1;
        local_258 = local_258 + 1;
LAB_00254500:
        pbVar4 = local_1c0;
        if (pbVar7 == pbVar8) {
switchD_00253d64_caseD_24:
          std::__cxx11::string::push_back((char)&local_250);
          pbVar7 = pbVar8;
          break;
        }
        goto LAB_00254534;
      }
LAB_00254530:
      pbVar8 = pbVar7 + 1;
      local_258 = local_258 + 1;
LAB_00254534:
      bVar9 = false;
      if ((local_259 == true) && (local_250._M_string_length == 1)) {
        bVar9 = *local_250._M_dataplus._M_p == '\\';
      }
      pbVar7 = pbVar8;
    } while (pbVar8 < pbVar4);
  }
  anon_unknown_3::_treat_buffer(&local_250,__return_storage_ptr__,local_254,local_258,&local_259);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                             local_250.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<token> tokenize(const std::string& str)
  {
  std::vector<token> tokens;
  std::string buff;

  const char* s = str.c_str();
  const char* s_end = str.c_str() + str.length();

  bool is_a_symbol = false;
  bool is_a_character = false;

  int line_nr = 1;
  int column_nr = 1;

  while (s < s_end)
    {
    //if (*s == ' ' || *s == '\n')
    if (ignore_character(*s))
      {
      _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
      is_a_character = false;
      //while (*s == ' ' || *s == '\n')
      while (ignore_character(*s))
        {
        if (*s == '\n')
          {
          ++line_nr;
          column_nr = 0;
          }
        ++s;
        ++column_nr;
        }
      }

    const char* s_copy = s;
    if (!is_a_character) // any special sign can appear as a character, e.g. #\(
      {
      switch (*s)
        {
        case '(':
        {
        if (is_a_symbol && buff.empty()) // #(
          {
          is_a_symbol = false;
          tokens.emplace_back(token::T_LEFT_ROUND_BRACKET, "#(", line_nr, column_nr);
          ++s;
          ++column_nr;
          break;
          }
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_LEFT_ROUND_BRACKET, "(", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case ')':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_RIGHT_ROUND_BRACKET, ")", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case '[':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_LEFT_SQUARE_BRACKET, "[", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case ']':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_RIGHT_SQUARE_BRACKET, "]", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case '#':
        {
        if (is_a_symbol)
          break;
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        const char* t = s;
        ++t;
        if (t && *t == ';') //treat as comment
          {
          while (*s && *s != '\n') // comment, so skip till end of the line
            ++s;
          ++s;
          ++line_nr;
          column_nr = 1;
          }
        else if (t && *t == '|') //treat as multiline comment
          {
          s = t;
          ++s; ++column_nr;
          bool end_of_comment_found = false;
          while (!end_of_comment_found)
            {
            while (*s && *s != '|')
              {
              if (*s == '\n')
                {
                ++line_nr;
                column_nr = 0;
                }
              ++s;
              ++column_nr;
              }
            if (!(*s) || (*(++s) == '#'))
              end_of_comment_found = true;
            }
          ++s; ++column_nr;
          }
        else
          {
          is_a_symbol = true;
          ++s;
          ++column_nr;
          }
        break;
        }
        case ';':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        while (*s && *s != '\n') // comment, so skip till end of the line
          ++s;
        ++s;
        ++line_nr;
        column_nr = 1;
        break;
        }
        case '\'':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_QUOTE, "'", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case '`':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_BACKQUOTE, "`", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case ',':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        const char* t = s;
        ++t;
        if (*t && *t == '@')
          {
          tokens.emplace_back(token::T_UNQUOTE_SPLICING, ",@", line_nr, column_nr);
          ++s;
          ++column_nr;
          }
        else
          {
          tokens.emplace_back(token::T_UNQUOTE, ",", line_nr, column_nr);
          }
        ++s;
        ++column_nr;
        break;
        }
        case '"':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        int temp_column_nr = column_nr;
        int temp_line_nr = line_nr;
        const char* t = s;
        ++t;
        ++column_nr;
        while (*t && *t != '"')
          {
          if (*t == '\n')
            {
            ++line_nr;
            column_nr = 0;
            }
          if (*t == '\\') // escape syntax
            {
            ++t;
            if (!*t)
              {
              tokens.emplace_back(token::T_BAD, std::string(s, t), temp_line_nr, temp_column_nr);
              break;
              }
            }
          ++t;
          ++column_nr;
          }
        if (*t)
          {
          ++t;
          ++column_nr;
          }
        tokens.emplace_back(token::T_STRING, replace_escape_chars(std::string(s, t)), temp_line_nr, temp_column_nr);
        s = t;
        break;
        }
        }
      }

    if (s_copy == s)
      {
      buff += *s;
      ++s;
      ++column_nr;
      }

    is_a_character = (is_a_symbol && buff.size() == 1 && buff[0] == '\\');
    }

  _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);

  return tokens;
  }